

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

tag_sizes tinyobj::parseTagTriple(char **token)

{
  tag_sizes tVar1;
  size_t sVar2;
  char **token_local;
  int iStack_10;
  tag_sizes ts;
  
  tag_sizes::tag_sizes((tag_sizes *)((long)&token_local + 4));
  sVar2 = strspn(*token," \t");
  *token = *token + sVar2;
  token_local._4_4_ = atoi(*token);
  sVar2 = strcspn(*token,"/ \t\r");
  *token = *token + sVar2;
  if (**token == '/') {
    *token = *token + 1;
    sVar2 = strspn(*token," \t");
    *token = *token + sVar2;
    iStack_10 = atoi(*token);
    sVar2 = strcspn(*token,"/ \t\r");
    *token = *token + sVar2;
    if (**token == '/') {
      *token = *token + 1;
      ts.num_ints = parseInt(token);
    }
  }
  tVar1.num_reals = iStack_10;
  tVar1.num_ints = token_local._4_4_;
  tVar1.num_strings = ts.num_ints;
  return tVar1;
}

Assistant:

static tag_sizes parseTagTriple(const char **token) {
  tag_sizes ts;

  (*token) += strspn((*token), " \t");
  ts.num_ints = atoi((*token));
  (*token) += strcspn((*token), "/ \t\r");
  if ((*token)[0] != '/') {
    return ts;
  }

  (*token)++;  // Skip '/'

  (*token) += strspn((*token), " \t");
  ts.num_reals = atoi((*token));
  (*token) += strcspn((*token), "/ \t\r");
  if ((*token)[0] != '/') {
    return ts;
  }
  (*token)++;  // Skip '/'

  ts.num_strings = parseInt(token);

  return ts;
}